

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool set_dic_path(OpenJTalk *oj,char *path)

{
  _Bool _Var1;
  size_t sVar2;
  long lVar3;
  char *in_RSI;
  long in_RDI;
  char temp2 [260];
  char temp [260];
  Open_JTalk *in_stack_fffffffffffffdb8;
  char *in_stack_fffffffffffffdc0;
  char local_238 [272];
  char local_128 [240];
  char *in_stack_ffffffffffffffc8;
  
  if (in_RDI == 0) {
    return false;
  }
  clear_path_string(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
  if ((in_RSI != (char *)0x0) && (sVar2 = strlen(in_RSI), sVar2 != 0)) {
    _Var1 = is_relative(in_stack_ffffffffffffffc8);
    if (_Var1) {
      sVar2 = strlen(g_current_path);
      if (sVar2 != 0) {
        sVar2 = strlen(g_current_path);
        lVar3 = sVar2 + 1;
        sVar2 = strlen(in_RSI);
        if (0x104 < lVar3 + sVar2 + 1) {
          return false;
        }
        strcpy(local_238,g_current_path);
        strcat(local_238,G_SLASH_CHAR);
        strcat(local_238,in_RSI);
        _Var1 = exists_dir((char *)temp2._88_8_);
        if (_Var1) {
          get_fullpath((char *)in_stack_fffffffffffffdb8,(char *)0x19206f);
          goto LAB_00192081;
        }
      }
    }
    else {
      strcpy(local_128,in_RSI);
      _Var1 = exists_dir((char *)temp2._88_8_);
      if (_Var1) {
LAB_00192081:
        if (local_128[0] == '\0') {
          return false;
        }
        strcpy((char *)(in_RDI + 8),local_128);
        Open_JTalk_load_dic(in_stack_fffffffffffffdb8,(char *)0x1920c6);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool set_dic_path(OpenJTalk *oj, const char *path)
{
	if (!oj)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	if (path != NULL && strlen(path) != 0)
	{
		// パスが絶対指定ならば
		if (!is_relative(path))
		{
			strcpy(temp, path);
			if (exists_dir(temp))
			{
				goto check_charset;
			}
		}
		// パスが相対指定ならば
		else
		{
			// カレントフォルダを探す
			if (g_current_path != NULL && strlen(g_current_path) != 0)
			{

				if (strlen(g_current_path) + 1 + strlen(path) + 1 > MAX_PATH)
				{
					return false;
				}

				char temp2[MAX_PATH];
				strcpy(temp2, g_current_path);
				strcat(temp2, G_SLASH_CHAR);
				strcat(temp2, path);

				if (exists_dir(temp2))
				{
					get_fullpath(temp2, temp);
					goto check_charset;
				}
			}
		}
	}
	return false;

check_charset:
	if (!*temp)
	{
		return false;
	}
	strcpy(oj->dn_dic_path, temp);
#if defined(_WIN32)
	char temp2[MAX_PATH];
	clear_path_string(temp2, MAX_PATH);
	u8tosjis_path(temp, temp2);
	Open_JTalk_load_dic(oj->open_jtalk, temp2);
#else
	Open_JTalk_load_dic(oj->open_jtalk, temp);
#endif
	return true;
}